

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v4::load_s_motions(xr_ogf_v4 *this,xr_reader *r)

{
  uint32_t uVar1;
  size_t sVar2;
  size_type sVar3;
  motion_io *__s;
  xr_skl_motion *this_00;
  undefined8 uVar4;
  allocator<char> local_59;
  string local_58;
  xr_skl_motion *local_38;
  motion_io *smotion;
  char *name;
  ulong uStack_20;
  uint32_t id;
  size_t num_motions;
  xr_reader *r_local;
  xr_ogf_v4 *this_local;
  
  num_motions = (size_t)r;
  r_local = (xr_reader *)this;
  sVar2 = xr_reader::find_chunk(r,0);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                  ,0x15e,"void xray_re::xr_ogf_v4::load_s_motions(xr_reader &)");
  }
  uVar1 = xr_reader::r_u32((xr_reader *)num_motions);
  uStack_20 = (ulong)uVar1;
  sVar3 = std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>::size
                    (&(this->super_xr_ogf).super_xr_object.m_motions);
  if (sVar3 == uStack_20) {
    name._4_4_ = 1;
    while( true ) {
      if (uStack_20 < name._4_4_) {
        xr_ogf::set_chunk_loaded(&this->super_xr_ogf,0xe);
        return;
      }
      sVar2 = xr_reader::find_chunk((xr_reader *)num_motions,name._4_4_);
      if (sVar2 == 0) break;
      __s = (motion_io *)xr_reader::skip_sz((xr_reader *)num_motions);
      smotion = __s;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,(char *)__s,&local_59);
      this_00 = xr_object::find_motion((xr_object *)this,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
      local_38 = this_00;
      if (this_00 == (xr_skl_motion *)0x0) {
        msg("unknown motion %s",smotion);
        uVar4 = __cxa_allocate_exception(1);
        __cxa_throw(uVar4,&xr_error::typeinfo,0);
      }
      motion_io::import_bone_motions
                ((motion_io *)this_00,(xr_reader *)num_motions,
                 &(this->super_xr_ogf).super_xr_object.m_bones);
      xr_reader::debug_find_chunk((xr_reader *)num_motions);
      name._4_4_ = name._4_4_ + 1;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                  ,0x163,"void xray_re::xr_ogf_v4::load_s_motions(xr_reader &)");
  }
  __assert_fail("m_motions.size() == num_motions",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                ,0x160,"void xray_re::xr_ogf_v4::load_s_motions(xr_reader &)");
}

Assistant:

void xr_ogf_v4::load_s_motions(xr_reader& r)
{
	if (!r.find_chunk(0))
		xr_not_expected();
	size_t num_motions = r.r_u32();
	xr_assert(m_motions.size() == num_motions);
	for (uint32_t id = 1; id <= num_motions; ++id) {
		if (!r.find_chunk(id))
			xr_not_expected();

		const char* name = r.skip_sz();
		motion_io* smotion = static_cast<motion_io*>(find_motion(name));
		if (smotion == 0) {
			msg("unknown motion %s", name);
			throw xr_error();
		}
		smotion->import_bone_motions(r, m_bones);
		r.debug_find_chunk();
	}
	set_chunk_loaded(OGF4_S_MOTIONS);
}